

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

wchar_t fmt::v7::detail::thousands_sep_impl<wchar_t>(locale_ref loc)

{
  wchar_t wVar1;
  numpunct *pnVar2;
  locale local_18 [8];
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale(local_18);
  }
  else {
    std::locale::locale(local_18,(locale *)loc.locale_);
  }
  pnVar2 = std::use_facet<std::__cxx11::numpunct<wchar_t>>(local_18);
  wVar1 = (**(code **)(*(long *)pnVar2 + 0x18))(pnVar2);
  std::locale::~locale(local_18);
  return wVar1;
}

Assistant:

FMT_FUNC Char thousands_sep_impl(locale_ref loc) {
  return std::use_facet<std::numpunct<Char>>(loc.get<std::locale>())
      .thousands_sep();
}